

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<absl::lts_20250127::Cord>::Swap
          (RepeatedField<absl::lts_20250127::Cord> *this,
          RepeatedField<absl::lts_20250127::Cord> *other)

{
  Arena *pAVar1;
  Arena *arena;
  RepeatedField<absl::lts_20250127::Cord> temp;
  ShortSooRep SStack_28;
  
  if (this != other) {
    pAVar1 = GetArena(this);
    arena = GetArena(other);
    if (pAVar1 == arena) {
      InternalSwap(this,other);
      return;
    }
    internal::ShortSooRep::ShortSooRep(&SStack_28,arena);
    MergeFrom((RepeatedField<absl::lts_20250127::Cord> *)&SStack_28,this);
    CopyFrom(this,other);
    UnsafeArenaSwap(other,(RepeatedField<absl::lts_20250127::Cord> *)&SStack_28);
    ~RepeatedField((RepeatedField<absl::lts_20250127::Cord> *)&SStack_28);
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  Arena* arena = GetArena();
  Arena* other_arena = other->GetArena();
  if (internal::CanUseInternalSwap(arena, other_arena)) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other_arena);
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}